

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

string * __thiscall
glu::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  long local_340;
  uint local_338;
  ostringstream o;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&o);
  pcVar7 = str + 3;
  while( true ) {
    cVar2 = pcVar7[-1];
    if (cVar2 != ' ') break;
    pcVar7 = pcVar7 + 1;
  }
  if (cVar2 == '\r') {
    cVar2 = *pcVar7;
  }
  else {
    pcVar7 = pcVar7 + -1;
  }
  pcVar7 = pcVar7 + (cVar2 == '\n');
  while( true ) {
    while( true ) {
      cVar2 = *pcVar7;
      if (cVar2 != '\\') break;
      cVar2 = pcVar7[1];
      if (cVar2 != '\0') {
        if (cVar2 == 't') {
          cVar2 = '\t';
        }
        else if (cVar2 == 'n') {
          cVar2 = '\n';
        }
        std::operator<<(&o.super_basic_ostream<char,_std::char_traits<char>_>,cVar2);
      }
      pcVar7 = pcVar7 + 2;
    }
    if ((cVar2 == '\"') && (pcVar7[1] == '\"')) break;
    pcVar7 = pcVar7 + 1;
    std::operator<<(&o.super_basic_ostream<char,_std::char_traits<char>_>,cVar2);
  }
  std::__cxx11::stringbuf::str();
  uVar4 = 0;
  uVar3 = (ulong)local_338;
  if ((int)local_338 < 1) {
    uVar3 = uVar4;
  }
  iVar8 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = *(byte *)(local_340 + uVar4);
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    iVar8 = iVar8 + (uint)(bVar1 == 9) * 3 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  iVar6 = 0;
  bVar1 = 1;
  iVar5 = 0;
  do {
    if ((int)local_338 <= iVar5) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&o);
      return __return_storage_ptr__;
    }
    cVar2 = *(char *)(local_340 + iVar5);
    if ((bool)(bVar1 & iVar6 < iVar8)) {
      if (cVar2 != ' ') {
        if (cVar2 == '\n') goto LAB_01595a20;
        if (cVar2 == '\r') goto LAB_01595a02;
        if (cVar2 != '\t') goto LAB_01595a32;
      }
      iVar6 = iVar6 + (uint)(cVar2 == '\t') * 3 + 1;
LAB_01595a2e:
      bVar1 = 1;
    }
    else {
      if (cVar2 == '\n') {
LAB_01595a20:
        std::operator<<(&local_1a8,cVar2);
        iVar6 = 0;
        goto LAB_01595a2e;
      }
      if (cVar2 == '\r') {
LAB_01595a02:
        if (*(char *)(local_340 + 1 + (long)iVar5) != '\n') goto LAB_01595a20;
        std::operator<<(&local_1a8,'\n');
        iVar5 = iVar5 + 1;
        iVar6 = 0;
        bVar1 = 1;
      }
      else {
LAB_01595a32:
        std::operator<<(&local_1a8,cVar2);
        bVar1 = 0;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

string ShaderParser::parseShaderSource (const char* str)
{
	const char*		p = str+2;
	ostringstream	o;

	// Eat first empty line from beginning.
	while (*p == ' ') p++;
	if (*p == '\r') p++;
	if (*p == '\n') p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}